

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O1

void __thiscall
fakeit::BoostTestAdapter::handle(BoostTestAdapter *this,SequenceVerificationEvent *evt)

{
  int line;
  string format;
  allocator local_79;
  string local_78;
  long *local_58;
  long local_50;
  long local_48 [2];
  string local_38;
  
  (*this->_formatter->_vptr_EventFormatter[1])(&local_58,this->_formatter,evt);
  std::__cxx11::string::string((string *)&local_38,*(char **)(evt + 0x10),&local_79);
  line = *(int *)(evt + 0x18);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_58,local_50 + (long)local_58);
  boost_fail(this,&local_38,line,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

virtual void handle(const SequenceVerificationEvent &evt) override {
            std::string format = _formatter.format(evt);
            boost_fail(evt.file(), evt.line(), format);
        }